

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_stepper.cpp
# Opt level: O3

int __thiscall QtMWidgets::Stepper::qt_metacall(Stepper *this,Call _c,int _id,void **_a)

{
  uint _id_00;
  undefined4 in_register_00000014;
  
  _id_00 = QWidget::qt_metacall((Call)this,_c,(void **)CONCAT44(in_register_00000014,_id));
  if ((-1 < (int)_id_00) && (_c < (BindableProperty|ReadProperty))) {
    if ((0x14eU >> (_c & 0x1f) & 1) == 0) {
      if (_c == InvokeMetaMethod) {
        if (_id_00 < 5) {
          qt_static_metacall((QObject *)this,InvokeMetaMethod,_id_00,_a);
        }
      }
      else {
        if (_c != RegisterMethodArgumentMetaType) {
          return _id_00;
        }
        if (_id_00 < 5) {
          *(undefined8 *)*_a = 0;
        }
      }
      _id_00 = _id_00 - 5;
    }
    else {
      qt_static_metacall((QObject *)this,_c,_id_00,_a);
      _id_00 = _id_00 - 7;
    }
  }
  return _id_00;
}

Assistant:

int QtMWidgets::Stepper::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QWidget::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 5)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 5;
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 5)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 5;
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 7;
    }
#endif // QT_NO_PROPERTIES
    return _id;
}